

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_path.c
# Opt level: O0

CURLcode Curl_get_pathname(char **cpp,char **path,char *homedir)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  long lStack_58;
  _Bool relativePath;
  size_t pathLength;
  size_t fullPathLength;
  uint local_40;
  uint j;
  uint i;
  char quot;
  char *end;
  char *cp;
  char *homedir_local;
  char **path_local;
  char **cpp_local;
  
  pcVar4 = *cpp;
  if (*pcVar4 == '\0') {
    *cpp = (char *)0x0;
    *path = (char *)0x0;
    cpp_local._4_4_ = CURLE_QUOTE_ERROR;
  }
  else {
    sVar2 = strspn(pcVar4," \t\r\n");
    end = pcVar4 + sVar2;
    sVar2 = strlen(end);
    sVar3 = strlen(homedir);
    pcVar4 = (char *)(*Curl_cmalloc)(sVar2 + sVar3 + 2);
    *path = pcVar4;
    if (*path == (char *)0x0) {
      cpp_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      if ((*end == '\"') || (*end == '\'')) {
        pcVar4 = end + 1;
        cVar1 = *end;
        fullPathLength._4_4_ = 0;
        for (local_40 = 0; sVar2 = strlen(pcVar4), local_40 <= sVar2; local_40 = local_40 + 1) {
          if (pcVar4[local_40] == cVar1) {
            local_40 = local_40 + 1;
            (*path)[fullPathLength._4_4_] = '\0';
            break;
          }
          if ((pcVar4[local_40] == '\0') ||
             ((((pcVar4[local_40] == '\\' && (local_40 = local_40 + 1, pcVar4[local_40] != '\'')) &&
               (pcVar4[local_40] != '\"')) && (pcVar4[local_40] != '\\')))) goto LAB_0016d70f;
          (*path)[fullPathLength._4_4_] = pcVar4[local_40];
          fullPathLength._4_4_ = fullPathLength._4_4_ + 1;
        }
        if (fullPathLength._4_4_ == 0) {
LAB_0016d70f:
          (*Curl_cfree)(*path);
          *path = (char *)0x0;
          return CURLE_QUOTE_ERROR;
        }
        sVar2 = strspn(pcVar4 + local_40," \t\r\n");
        *cpp = pcVar4 + sVar2 + local_40;
      }
      else {
        _i = strpbrk(end," \t\r\n");
        if (_i == (char *)0x0) {
          _i = strchr(end,0);
        }
        sVar2 = strspn(_i," \t\r\n");
        *cpp = _i + sVar2;
        lStack_58 = 0;
        bVar5 = false;
        if ((*end == '/') && (bVar5 = false, end[1] == '~')) {
          bVar5 = end[2] == '/';
        }
        if (bVar5) {
          strcpy(*path,homedir);
          sVar2 = strlen(homedir);
          lStack_58 = sVar2 + 1;
          (*path)[sVar2] = '/';
          (*path)[lStack_58] = '\0';
          end = end + 3;
        }
        memcpy(*path + lStack_58,end,(long)((int)_i - (int)end));
        (*path)[((int)_i - (int)end) + lStack_58] = '\0';
      }
      cpp_local._4_4_ = CURLE_OK;
    }
  }
  return cpp_local._4_4_;
}

Assistant:

CURLcode Curl_get_pathname(const char **cpp, char **path, char *homedir)
{
  const char *cp = *cpp, *end;
  char quot;
  unsigned int i, j;
  size_t fullPathLength, pathLength;
  bool relativePath = false;
  static const char WHITESPACE[] = " \t\r\n";

  if(!*cp) {
    *cpp = NULL;
    *path = NULL;
    return CURLE_QUOTE_ERROR;
  }
  /* Ignore leading whitespace */
  cp += strspn(cp, WHITESPACE);
  /* Allocate enough space for home directory and filename + separator */
  fullPathLength = strlen(cp) + strlen(homedir) + 2;
  *path = malloc(fullPathLength);
  if(*path == NULL)
    return CURLE_OUT_OF_MEMORY;

  /* Check for quoted filenames */
  if(*cp == '\"' || *cp == '\'') {
    quot = *cp++;

    /* Search for terminating quote, unescape some chars */
    for(i = j = 0; i <= strlen(cp); i++) {
      if(cp[i] == quot) {  /* Found quote */
        i++;
        (*path)[j] = '\0';
        break;
      }
      if(cp[i] == '\0') {  /* End of string */
        /*error("Unterminated quote");*/
        goto fail;
      }
      if(cp[i] == '\\') {  /* Escaped characters */
        i++;
        if(cp[i] != '\'' && cp[i] != '\"' &&
            cp[i] != '\\') {
          /*error("Bad escaped character '\\%c'",
              cp[i]);*/
          goto fail;
        }
      }
      (*path)[j++] = cp[i];
    }

    if(j == 0) {
      /*error("Empty quotes");*/
      goto fail;
    }
    *cpp = cp + i + strspn(cp + i, WHITESPACE);
  }
  else {
    /* Read to end of filename - either to white space or terminator */
    end = strpbrk(cp, WHITESPACE);
    if(end == NULL)
      end = strchr(cp, '\0');
    /* return pointer to second parameter if it exists */
    *cpp = end + strspn(end, WHITESPACE);
    pathLength = 0;
    relativePath = (cp[0] == '/' && cp[1] == '~' && cp[2] == '/');
    /* Handling for relative path - prepend home directory */
    if(relativePath) {
      strcpy(*path, homedir);
      pathLength = strlen(homedir);
      (*path)[pathLength++] = '/';
      (*path)[pathLength] = '\0';
      cp += 3;
    }
    /* Copy path name up until first "white space" */
    memcpy(&(*path)[pathLength], cp, (int)(end - cp));
    pathLength += (int)(end - cp);
    (*path)[pathLength] = '\0';
  }
  return CURLE_OK;

  fail:
  Curl_safefree(*path);
  return CURLE_QUOTE_ERROR;
}